

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O3

void __thiscall jrtplib::RTCPCompoundPacket::~RTCPCompoundPacket(RTCPCompoundPacket *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_0013c7d8;
  ClearPacketList(this);
  if ((this->compoundpacket != (uint8_t *)0x0) && (this->deletepacket == true)) {
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      operator_delete__(this->compoundpacket);
    }
    else {
      (**(code **)(*(long *)pRVar1 + 0x18))();
    }
  }
  p_Var3 = (this->rtcppacklist).
           super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->rtcppacklist) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

RTCPCompoundPacket::~RTCPCompoundPacket()
{
	ClearPacketList();
	if (compoundpacket && deletepacket)
		RTPDeleteByteArray(compoundpacket,GetMemoryManager());
}